

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clock.cc
# Opt level: O3

void AbslInternalSleepFor_lts_20250127(Duration duration)

{
  HiRep HVar1;
  int iVar2;
  int *piVar3;
  undefined8 in_RDX;
  uint32_t uVar4;
  Duration d;
  Duration rhs;
  Duration local_50;
  timespec local_40;
  undefined8 extraout_RDX;
  
  local_50.rep_lo_ = duration.rep_lo_;
  local_50.rep_hi_ = duration.rep_hi_;
  do {
    HVar1 = local_50.rep_hi_;
    if (local_50.rep_hi_ == (HiRep)0x0) {
      if (local_50.rep_lo_ == 0) {
        return;
      }
    }
    else if ((long)local_50.rep_hi_ < 1) {
      return;
    }
    uVar4 = local_50.rep_lo_;
    if (local_50.rep_hi_ == (HiRep)0x7fffffffffffffff) {
      uVar4 = 0;
    }
    d.rep_hi_.hi_ = 0;
    d.rep_hi_.lo_ = uVar4;
    d.rep_lo_ = (uint32_t)in_RDX;
    local_40 = absl::lts_20250127::ToTimespec((lts_20250127 *)local_50.rep_hi_,d);
    do {
      iVar2 = nanosleep((timespec *)&local_40,(timespec *)&local_40);
      if (iVar2 == 0) break;
      piVar3 = __errno_location();
    } while (*piVar3 == 4);
    rhs.rep_lo_ = uVar4;
    rhs.rep_hi_ = HVar1;
    absl::lts_20250127::Duration::operator-=(&local_50,rhs);
    in_RDX = extraout_RDX;
  } while( true );
}

Assistant:

ABSL_ATTRIBUTE_WEAK void ABSL_INTERNAL_C_SYMBOL(AbslInternalSleepFor)(
    absl::Duration duration) {
  while (duration > absl::ZeroDuration()) {
    absl::Duration to_sleep = std::min(duration, absl::MaxSleep());
    absl::SleepOnce(to_sleep);
    duration -= to_sleep;
  }
}